

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O1

void glist_retext(_glist *glist,t_text *y)

{
  _rtext *x;
  
  if ((glist->gl_editor != (t_editor *)0x0) && (glist->gl_editor->e_rtext != (_rtext *)0x0)) {
    x = glist_findrtext(glist,y);
    if (x != (_rtext *)0x0) {
      rtext_retext(x);
      return;
    }
  }
  return;
}

Assistant:

void glist_retext(t_glist *glist, t_text *y)
{
    t_canvas *c = glist_getcanvas(glist);
        /* check that we have built rtexts yet.  LATER need a better test. */
    if (glist->gl_editor && glist->gl_editor->e_rtext)
    {
        t_rtext *rt = glist_findrtext(glist, y);
        if (rt)
            rtext_retext(rt);
    }
}